

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O0

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::moldudp64_session
          (moldudp64_session<helix::parity::pmd_handler> *this,void *data)

{
  void *in_RSI;
  session *in_RDI;
  pmd_handler *in_stack_ffffffffffffffe0;
  
  session::session(in_RDI,in_RSI);
  in_RDI->_vptr_session = (_func_int **)&PTR__moldudp64_session_0015dd00;
  parity::pmd_handler::pmd_handler(in_stack_ffffffffffffffe0);
  std::function<void_(char_*,_unsigned_long)>::function
            ((function<void_(char_*,_unsigned_long)> *)in_stack_ffffffffffffffe0);
  in_RDI[0xf]._data = (void *)0x1;
  *(undefined4 *)&in_RDI[0x10]._vptr_session = 0;
  std::experimental::fundamentals_v1::optional<unsigned_long>::optional
            ((optional<unsigned_long> *)0x1481ef);
  return;
}

Assistant:

moldudp64_session<Handler>::moldudp64_session(void* data)
    : session{data}
{
}